

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void llvm::APInt::udivrem(APInt *LHS,uint64_t RHS,APInt *Quotient,uint64_t *Remainder)

{
  bool bVar1;
  uint uVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint64_t lhsValue;
  APInt local_70;
  APInt local_60;
  uint local_4c;
  undefined1 local_48 [4];
  uint lhsWords;
  ulong local_38;
  uint64_t QuotVal;
  uint64_t *puStack_28;
  uint BitWidth;
  uint64_t *Remainder_local;
  APInt *Quotient_local;
  uint64_t RHS_local;
  APInt *LHS_local;
  
  puStack_28 = Remainder;
  Remainder_local = (uint64_t *)Quotient;
  Quotient_local = (APInt *)RHS;
  RHS_local = (uint64_t)LHS;
  if (RHS == 0) {
    __assert_fail("RHS != 0 && \"Divide by zero?\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x6fc,
                  "static void llvm::APInt::udivrem(const APInt &, uint64_t, APInt &, uint64_t &)");
  }
  QuotVal._4_4_ = LHS->BitWidth;
  bVar1 = isSingleWord(LHS);
  if (bVar1) {
    local_38 = *(ulong *)RHS_local / (ulong)Quotient_local;
    *puStack_28 = *(ulong *)RHS_local % (ulong)Quotient_local;
    APInt((APInt *)local_48,QuotVal._4_4_,local_38,false);
    operator=((APInt *)Remainder_local,(APInt *)local_48);
    ~APInt((APInt *)local_48);
  }
  else {
    uVar2 = getActiveBits((APInt *)RHS_local);
    local_4c = getNumWords(uVar2);
    if (local_4c == 0) {
      APInt(&local_60,QuotVal._4_4_,0,false);
      operator=((APInt *)Remainder_local,&local_60);
      ~APInt(&local_60);
      *puStack_28 = 0;
    }
    else if (Quotient_local == (APInt *)0x1) {
      operator=((APInt *)Remainder_local,(APInt *)RHS_local);
      *puStack_28 = 0;
    }
    else {
      bVar1 = ult((APInt *)RHS_local,(uint64_t)Quotient_local);
      if (bVar1) {
        uVar3 = getZExtValue((APInt *)RHS_local);
        *puStack_28 = uVar3;
        APInt(&local_70,QuotVal._4_4_,0,false);
        operator=((APInt *)Remainder_local,&local_70);
        ~APInt(&local_70);
      }
      else {
        bVar1 = operator==((APInt *)RHS_local,(uint64_t)Quotient_local);
        if (bVar1) {
          APInt((APInt *)&lhsValue,QuotVal._4_4_,1,false);
          operator=((APInt *)Remainder_local,(APInt *)&lhsValue);
          ~APInt((APInt *)&lhsValue);
          *puStack_28 = 0;
        }
        else {
          reallocate((APInt *)Remainder_local,QuotVal._4_4_);
          if (local_4c == 1) {
            uVar4 = **(ulong **)RHS_local;
            operator=((APInt *)Remainder_local,uVar4 / (ulong)Quotient_local);
            *puStack_28 = uVar4 % (ulong)Quotient_local;
          }
          else {
            divide(*(WordType **)RHS_local,local_4c,(WordType *)&Quotient_local,1,
                   (WordType *)*Remainder_local,puStack_28);
            uVar3 = *Remainder_local;
            uVar4 = (ulong)local_4c;
            uVar2 = getNumWords(QuotVal._4_4_);
            memset((void *)(uVar3 + uVar4 * 8),0,(ulong)((uVar2 - local_4c) * 8));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void APInt::udivrem(const APInt &LHS, uint64_t RHS, APInt &Quotient,
                    uint64_t &Remainder) {
  assert(RHS != 0 && "Divide by zero?");
  unsigned BitWidth = LHS.BitWidth;

  // First, deal with the easy case
  if (LHS.isSingleWord()) {
    uint64_t QuotVal = LHS.U.VAL / RHS;
    Remainder = LHS.U.VAL % RHS;
    Quotient = APInt(BitWidth, QuotVal);
    return;
  }

  // Get some size facts about the dividend and divisor
  unsigned lhsWords = getNumWords(LHS.getActiveBits());

  // Check the degenerate cases
  if (lhsWords == 0) {
    Quotient = APInt(BitWidth, 0);    // 0 / Y ===> 0
    Remainder = 0;                    // 0 % Y ===> 0
    return;
  }

  if (RHS == 1) {
    Quotient = LHS;                   // X / 1 ===> X
    Remainder = 0;                    // X % 1 ===> 0
    return;
  }

  if (LHS.ult(RHS)) {
    Remainder = LHS.getZExtValue();   // X % Y ===> X, iff X < Y
    Quotient = APInt(BitWidth, 0);    // X / Y ===> 0, iff X < Y
    return;
  }

  if (LHS == RHS) {
    Quotient  = APInt(BitWidth, 1);   // X / X ===> 1
    Remainder = 0;                    // X % X ===> 0;
    return;
  }

  // Make sure there is enough space to hold the results.
  // NOTE: This assumes that reallocate won't affect any bits if it doesn't
  // change the size. This is necessary if Quotient is aliased with LHS.
  Quotient.reallocate(BitWidth);

  if (lhsWords == 1) { // rhsWords is 1 if lhsWords is 1.
    // There is only one word to consider so use the native versions.
    uint64_t lhsValue = LHS.U.pVal[0];
    Quotient = lhsValue / RHS;
    Remainder = lhsValue % RHS;
    return;
  }

  // Okay, lets do it the long way
  divide(LHS.U.pVal, lhsWords, &RHS, 1, Quotient.U.pVal, &Remainder);
  // Clear the rest of the Quotient.
  std::memset(Quotient.U.pVal + lhsWords, 0,
              (getNumWords(BitWidth) - lhsWords) * APINT_WORD_SIZE);
}